

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall UnitTestBasehello11::Run(UnitTestBasehello11 *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  UnitTestBase *pUVar3;
  Regex t;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  Regex local_50;
  
  bert::Regex::Regex(&local_50,"[^abc]*");
  bVar2 = bert::Regex::Match(&local_50,"xyz");
  paVar1 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  if (bVar2) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"\'t.Match(\"xyz\")\'","");
    pUVar3 = UnitTestBase::SetInfo(&this->super_UnitTestBase,&local_70,true,false);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"\'t.Match(\"xyz\")\'","");
    pUVar3 = UnitTestBase::SetInfo(&this->super_UnitTestBase,&local_70,false,false);
  }
  UnitTestBase::FlushError(pUVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  bVar2 = bert::Regex::Match(&local_50,"a");
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  if (bVar2) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"\'!(t.Match(\"a\"))\'","");
    pUVar3 = UnitTestBase::SetInfo(&this->super_UnitTestBase,&local_b0,false,false);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"\'!(t.Match(\"a\"))\'","");
    pUVar3 = UnitTestBase::SetInfo(&this->super_UnitTestBase,&local_b0,true,false);
  }
  UnitTestBase::FlushError(pUVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  bVar2 = bert::Regex::Match(&local_50,"b");
  paVar1 = &local_90.field_2;
  local_90._M_dataplus._M_p = (pointer)paVar1;
  if (bVar2) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"\'!(t.Match(\"b\"))\'","");
    pUVar3 = UnitTestBase::SetInfo(&this->super_UnitTestBase,&local_90,false,false);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"\'!(t.Match(\"b\"))\'","");
    pUVar3 = UnitTestBase::SetInfo(&this->super_UnitTestBase,&local_90,true,false);
  }
  UnitTestBase::FlushError(pUVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  bVar2 = bert::Regex::Match(&local_50,"abc");
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  if (bVar2) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d0,"\'!(t.Match(\"abc\"))\'","");
    pUVar3 = UnitTestBase::SetInfo(&this->super_UnitTestBase,&local_d0,false,false);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d0,"\'!(t.Match(\"abc\"))\'","");
    pUVar3 = UnitTestBase::SetInfo(&this->super_UnitTestBase,&local_d0,true,false);
  }
  UnitTestBase::FlushError(pUVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  bVar2 = bert::Regex::Match(&local_50,"fuckabc");
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  if (bVar2) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f0,"\'!(t.Match(\"fuckabc\"))\'","");
    pUVar3 = UnitTestBase::SetInfo(&this->super_UnitTestBase,&local_f0,false,false);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f0,"\'!(t.Match(\"fuckabc\"))\'","");
    pUVar3 = UnitTestBase::SetInfo(&this->super_UnitTestBase,&local_f0,true,false);
  }
  UnitTestBase::FlushError(pUVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  bert::Regex::~Regex(&local_50);
  return;
}

Assistant:

TEST_CASE(hello11)
{
    Regex t("[^abc]*");
    EXPECT_TRUE(t.Match("xyz"));
    EXPECT_FALSE(t.Match("a"));
    EXPECT_FALSE(t.Match("b"));
    EXPECT_FALSE(t.Match("abc"));
    EXPECT_FALSE(t.Match("fuckabc"));
}